

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManArePrintListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  int iVar1;
  undefined8 local_20;
  Gia_StaAre_t *pCube;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t Root_local;
  
  local_20 = Gia_ManAreSta(p,Root);
  while( true ) {
    iVar1 = Gia_StaIsGood(p,local_20);
    if (iVar1 == 0) break;
    iVar1 = Gia_StaIsUsed(local_20);
    if (iVar1 != 0) {
      Gia_ManArePrintCube(p,local_20);
    }
    local_20 = Gia_StaNext(p,local_20);
  }
  return 1;
}

Assistant:

static inline int Gia_ManArePrintListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManArePrintCube( p, pCube );
    return 1;
}